

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.cpp
# Opt level: O2

void ot::commissioner::ComputeBloomFilter(ByteArray *aOut,ByteArray *aIn)

{
  uint8_t aByte;
  uint8_t *puVar1;
  uint __line;
  char *__assertion;
  long lVar2;
  ulong uVar3;
  uint8_t *puVar4;
  Crc16 ansi;
  Crc16 ccitt;
  
  Crc16::Crc16(&ccitt,kCcitt);
  Crc16::Crc16(&ansi,kAnsi);
  lVar2 = (long)(aOut->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(aOut->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar2 == 0) {
    __assertion = "!aOut.empty()";
    __line = 0x37;
  }
  else {
    uVar3 = lVar2 * 8;
    if (uVar3 < 0x100) {
      puVar1 = (aIn->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar4 = (aIn->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                    .super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
        aByte = *puVar4;
        Crc16::Update(&ccitt,aByte);
        Crc16::Update(&ansi,aByte);
      }
      SetBit(aOut,(uint8_t)((ulong)ccitt.mCrc % uVar3));
      SetBit(aOut,(uint8_t)((ulong)ansi.mCrc % uVar3));
      return;
    }
    __assertion = "numBits <= std::numeric_limits<uint8_t>::max()";
    __line = 0x38;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/openthread/bloom_filter.cpp"
                ,__line,"void ot::commissioner::ComputeBloomFilter(ByteArray &, const ByteArray &)")
  ;
}

Assistant:

void ComputeBloomFilter(ByteArray &aOut, const ByteArray &aIn)
{
    Crc16 ccitt(Crc16::Polynomial::kCcitt);
    Crc16 ansi(Crc16::Polynomial::kAnsi);

    const size_t numBits = aOut.size() * 8;

    assert(!aOut.empty());
    assert(numBits <= std::numeric_limits<uint8_t>::max());

    for (auto byte : aIn)
    {
        ccitt.Update(byte);
        ansi.Update(byte);
    }

    SetBit(aOut, ccitt.Get() % numBits);
    SetBit(aOut, ansi.Get() % numBits);
}